

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O1

void * Thread::threadFun(void *arg)

{
  if (*(long *)((long)arg + 0x18) != 0) {
    (**(code **)((long)arg + 0x20))((long)arg + 8);
    return (void *)0x0;
  }
  std::__throw_bad_function_call();
}

Assistant:

void* Thread::threadFun(void* arg)
{
    Thread* thread= static_cast<Thread*>(arg);
    thread->threadFun_();
    return NULL;
}